

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

CheckerInstanceStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CheckerInstanceStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::CheckerInstantiationSyntax&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,
          CheckerInstantiationSyntax *args_2)

{
  CheckerInstanceStatementSyntax *this_00;
  
  this_00 = (CheckerInstanceStatementSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CheckerInstanceStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (CheckerInstanceStatementSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  slang::syntax::StatementSyntax::StatementSyntax
            (&this_00->super_StatementSyntax,CheckerInstanceStatement,*args,args_1);
  (this_00->instance).ptr = args_2;
  (args_2->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)this_00;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }